

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall IdentifierTokenizerRule::~IdentifierTokenizerRule(IdentifierTokenizerRule *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (!isLiteralFirst(reader->charAt(i))) {
      return std::make_pair(false, 0);
    }

    i++;

    for (; reader->charAt(i) != '\0'; i++) {
      if (!isLiteralRest(reader->charAt(i))) {
        break;
      }
    }

    return std::make_pair(true, i);
  }